

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O3

char * mserialize::detail::write_integer_as_hex<short>(short v,char *end)

{
  ushort uVar1;
  char *pcVar2;
  ushort uVar3;
  uint uVar4;
  
  uVar4 = (uint)(ushort)v;
  if (v == 0) {
    end[-1] = '0';
    return end + -1;
  }
  if (v < 1) {
    pcVar2 = end + -1;
    do {
      uVar1 = (ushort)uVar4;
      uVar3 = uVar1;
      if ((short)uVar1 < 0) {
        uVar3 = uVar1 + 0xf;
      }
      *pcVar2 = "0123456789ABCDEF"[-(long)((short)uVar1 % 0x10)];
      uVar4 = (uint)(int)(short)uVar3 >> 4;
      pcVar2 = pcVar2 + -1;
    } while (0x1e < (ushort)(uVar1 + 0xf));
    *pcVar2 = '-';
    return pcVar2;
  }
  do {
    uVar1 = (ushort)uVar4;
    uVar3 = uVar1;
    if ((short)uVar1 < 0) {
      uVar3 = uVar1 + 0xf;
    }
    end[-1] = "0123456789ABCDEF"[(short)uVar1 % 0x10];
    end = end + -1;
    uVar4 = (uint)(int)(short)uVar3 >> 4;
  } while (0x1e < (ushort)(uVar1 + 0xf));
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}